

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.hpp
# Opt level: O2

bool Diligent::PRSSerializer<(Diligent::SerializerMode)2>::
     SerializeInternalData<Diligent::PipelineResourceSignatureInternalDataGL>
               (Serializer<(Diligent::SerializerMode)2> *Ser,
               ConstQual<Diligent::PipelineResourceSignatureInternalDataGL> *InternalData,
               DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  
  bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()
                    (Ser,(SHADER_TYPE *)InternalData,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                      ).StaticResShaderStages,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                      ).PipelineType,
                     &(InternalData->
                      super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                      ).StaticResStageIndex);
  if (bVar1) {
    bVar1 = Serializer<(Diligent::SerializerMode)2>::
            SerializeArray<Diligent::PipelineResourceAttribsGL_const*const,unsigned_int_const,Diligent::Serializer<(Diligent::SerializerMode)2>::SerializeArrayRaw<Diligent::PipelineResourceAttribsGL_const*const,unsigned_int_const>(Diligent::DynamicLinearAllocator*,Diligent::PipelineResourceAttribsGL_const*const&,unsigned_int_const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,auto:1&)_1_>
                      (Ser,Allocator,
                       &(InternalData->
                        super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                        ).pResourceAttribs,
                       &(InternalData->
                        super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                        ).NumResources);
    if (bVar1) {
      bVar1 = Serializer<(Diligent::SerializerMode)2>::
              SerializeArray<Diligent::ImmutableSamplerAttribsGL_const*const,unsigned_int_const,Diligent::Serializer<(Diligent::SerializerMode)2>::SerializeArrayRaw<Diligent::ImmutableSamplerAttribsGL_const*const,unsigned_int_const>(Diligent::DynamicLinearAllocator*,Diligent::ImmutableSamplerAttribsGL_const*const&,unsigned_int_const&)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)2>&,auto:1&)_1_>
                        (Ser,Allocator,
                         &(InternalData->
                          super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                          ).pImmutableSamplers,
                         &(InternalData->
                          super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsGL,_Diligent::ImmutableSamplerAttribsGL>
                          ).NumImmutableSamplers);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static bool SerializeInternalData(Serializer<Mode>&                                     Ser,
                                      ConstQual<PipelineResourceSignatureInternalDataType>& InternalData,
                                      DynamicLinearAllocator*                               Allocator)
    {
        if (!Ser(InternalData.ShaderStages,
                 InternalData.StaticResShaderStages,
                 InternalData.PipelineType,
                 InternalData.StaticResStageIndex))
            return false;

        if (!Ser.SerializeArrayRaw(Allocator, InternalData.pResourceAttribs, InternalData.NumResources))
            return false;

        if (!Ser.SerializeArrayRaw(Allocator, InternalData.pImmutableSamplers, InternalData.NumImmutableSamplers))
            return false;

        return true;
    }